

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O0

void __thiscall cfd::CfdManager::Finalize(CfdManager *this,bool is_finish_process)

{
  byte in_SIL;
  long in_RDI;
  CfdSourceLocation local_28;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (((*(byte *)(in_RDI + 0x10) & 1) != 0) && ((*(byte *)(in_RDI + 0x11) & 1) == 0)) {
    if (local_9 == 0) {
      local_28.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_manager.cpp"
                   ,0x2f);
      local_28.filename = local_28.filename + 1;
      local_28.line = 0x37;
      local_28.funcname = "Finalize";
      core::logger::info<>(&local_28,"cfd finalize.");
    }
    core::Finalize(*(CfdCoreHandle *)(in_RDI + 8),(bool)(local_9 & 1));
    *(undefined1 *)(in_RDI + 0x11) = 1;
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void CfdManager::Finalize(bool is_finish_process) {
  if (initialized_ && (!finalized_)) {
    if (!is_finish_process) {
      info(CFD_LOG_SOURCE, "cfd finalize.");
    }
    cfd::core::Finalize(handle_, is_finish_process);
    finalized_ = true;
    handle_ = nullptr;
  }
}